

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>_> *
__thiscall
testing::internal::
MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>>
          (PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>_>
           *__return_storage_ptr__,internal *this,UnorderedElementsAreArrayMatcher<int> *matcher)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  _Vector_base<int,_std::allocator<int>_> local_20;
  
  piVar1 = *(pointer *)(this + 0x18);
  piVar2 = *(pointer *)(this + 8);
  piVar3 = *(pointer *)(this + 0x10);
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  (__return_storage_ptr__->matcher_).match_flags_ = *(Flags *)this;
  (__return_storage_ptr__->matcher_).matchers_.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_start = piVar2;
  (__return_storage_ptr__->matcher_).matchers_.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_finish = piVar3;
  (__return_storage_ptr__->matcher_).matchers_.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = piVar1;
  local_20._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_20._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_20);
  return __return_storage_ptr__;
}

Assistant:

inline PredicateFormatterFromMatcher<M> MakePredicateFormatterFromMatcher(
    M matcher) {
  return PredicateFormatterFromMatcher<M>(std::move(matcher));
}